

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsSecondPartialDerivativeWRTStateControl
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          MatrixDynSize *partialDerivative)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  Index size;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  string *psVar14;
  ostream *poVar15;
  _Base_ptr p_Var16;
  ulong uVar17;
  ulong uVar18;
  _Rb_tree_header *p_Var19;
  bool bVar20;
  ostringstream errorMsg;
  long *local_1e8;
  long local_1d8 [2];
  VectorDynSize *local_1c8;
  MatrixDynSize *local_1c0;
  _Base_ptr local_1b8;
  undefined8 uStack_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar9 = iDynTree::MatrixDynSize::rows();
  lVar10 = iDynTree::VectorDynSize::size();
  if (lVar9 == lVar10) {
    lVar9 = iDynTree::MatrixDynSize::cols();
    lVar10 = iDynTree::VectorDynSize::size();
    if (lVar9 == lVar10) goto LAB_00147065;
  }
  uVar11 = iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)partialDerivative,uVar11);
LAB_00147065:
  p_Var16 = (this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var19 = &(this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header;
  bVar20 = (_Rb_tree_header *)p_Var16 == p_Var19;
  if (!bVar20) {
    bVar6 = true;
    local_1c8 = control;
    local_1c0 = partialDerivative;
    do {
      bVar7 = TimeRange::isInRange((TimeRange *)&p_Var16[8]._M_left,time);
      if (bVar7) {
        cVar8 = (**(code **)(**(long **)(p_Var16 + 2) + 0x38))
                          (time,*(long **)(p_Var16 + 2),state,control,p_Var16 + 5);
        if (cVar8 == '\0') {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error while evaluating cost ",0x1c);
          psVar14 = Cost::name_abi_cxx11_(*(Cost **)(p_Var16 + 2));
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(psVar14->_M_dataplus)._M_p,
                               psVar14->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,".",1);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError
                    ("OptimalControlProblem","costSecondPartialDerivativeWRTStateControl",
                     (char *)local_1e8);
        }
        else {
          lVar9 = iDynTree::MatrixDynSize::rows();
          lVar10 = iDynTree::VectorDynSize::size();
          if (lVar9 == lVar10) {
            lVar9 = iDynTree::MatrixDynSize::cols();
            lVar10 = iDynTree::VectorDynSize::size();
            if (lVar9 == lVar10) {
              lVar9 = iDynTree::MatrixDynSize::data();
              iDynTree::MatrixDynSize::rows();
              iDynTree::MatrixDynSize::cols();
              local_1b8 = p_Var16[8]._M_parent;
              uStack_1b0 = 0;
              uVar11 = iDynTree::MatrixDynSize::data();
              lVar10 = iDynTree::MatrixDynSize::rows();
              lVar12 = iDynTree::MatrixDynSize::cols();
              uVar13 = lVar12 * lVar10;
              if (bVar6) {
                uVar17 = uVar13;
                if (((uVar11 & 7) == 0) &&
                   (uVar17 = (ulong)((uint)(uVar11 >> 3) & 1), (long)uVar13 <= (long)uVar17)) {
                  uVar17 = uVar13;
                }
                if (0 < (long)uVar17) {
                  uVar18 = 0;
                  do {
                    *(double *)(uVar11 + uVar18 * 8) =
                         *(double *)(lVar9 + uVar18 * 8) * (double)local_1b8;
                    uVar18 = uVar18 + 1;
                  } while (uVar17 != uVar18);
                }
                lVar12 = uVar13 - uVar17;
                lVar10 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
                if (1 < lVar12) {
                  do {
                    pdVar1 = (double *)(lVar9 + uVar17 * 8);
                    dVar4 = pdVar1[1];
                    pdVar2 = (double *)(uVar11 + uVar17 * 8);
                    *pdVar2 = *pdVar1 * (double)local_1b8;
                    pdVar2[1] = dVar4 * (double)local_1b8;
                    uVar17 = uVar17 + 2;
                  } while ((long)uVar17 < lVar10);
                }
                if (lVar10 < (long)uVar13) {
                  do {
                    *(double *)(uVar11 + lVar10 * 8) =
                         *(double *)(lVar9 + lVar10 * 8) * (double)local_1b8;
                    lVar10 = lVar10 + 1;
                  } while (uVar13 - lVar10 != 0);
                }
                bVar6 = false;
              }
              else {
                uVar17 = uVar13;
                if (((uVar11 & 7) == 0) &&
                   (uVar17 = (ulong)((uint)(uVar11 >> 3) & 1), (long)uVar13 <= (long)uVar17)) {
                  uVar17 = uVar13;
                }
                if (0 < (long)uVar17) {
                  uVar18 = 0;
                  do {
                    *(double *)(uVar11 + uVar18 * 8) =
                         *(double *)(lVar9 + uVar18 * 8) * (double)local_1b8 +
                         *(double *)(uVar11 + uVar18 * 8);
                    uVar18 = uVar18 + 1;
                  } while (uVar17 != uVar18);
                }
                lVar12 = uVar13 - uVar17;
                lVar10 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
                if (1 < lVar12) {
                  do {
                    pdVar1 = (double *)(lVar9 + uVar17 * 8);
                    dVar5 = pdVar1[1];
                    pdVar2 = (double *)(uVar11 + uVar17 * 8);
                    dVar4 = pdVar2[1];
                    pdVar3 = (double *)(uVar11 + uVar17 * 8);
                    *pdVar3 = *pdVar1 * (double)local_1b8 + *pdVar2;
                    pdVar3[1] = dVar5 * (double)local_1b8 + dVar4;
                    uVar17 = uVar17 + 2;
                  } while ((long)uVar17 < lVar10);
                }
                if (lVar10 < (long)uVar13) {
                  do {
                    *(double *)(uVar11 + lVar10 * 8) =
                         *(double *)(lVar9 + lVar10 * 8) * (double)local_1b8 +
                         *(double *)(uVar11 + lVar10 * 8);
                    lVar10 = lVar10 + 1;
                  } while (uVar13 - lVar10 != 0);
                }
              }
              bVar7 = true;
              control = local_1c8;
              goto LAB_0014736f;
            }
          }
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error while evaluating ",0x17);
          psVar14 = Cost::name_abi_cxx11_(*(Cost **)(p_Var16 + 2));
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(psVar14->_M_dataplus)._M_p,
                               psVar14->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,": ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,
                     "the hessian size is expected to have as many rows as the state dimension and a number of columns matching the control dimension."
                     ,0x80);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError
                    ("OptimalControlProblem","costSecondPartialDerivativeWRTStateControl",
                     (char *)local_1e8);
        }
        if (local_1e8 != local_1d8) {
          operator_delete(local_1e8,local_1d8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar7 = false;
      }
      else {
        bVar7 = true;
      }
LAB_0014736f:
      if (!bVar7) {
        return bVar20;
      }
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      bVar20 = (_Rb_tree_header *)p_Var16 == p_Var19;
    } while (!bVar20);
  }
  return bVar20;
}

Assistant:

bool OptimalControlProblem::costsSecondPartialDerivativeWRTStateControl(double time, const VectorDynSize &state, const VectorDynSize &control, MatrixDynSize &partialDerivative)
        {
            if ((partialDerivative.rows() != state.size()) || (partialDerivative.cols() != control.size())) {
                partialDerivative.resize(state.size(), control.size());
            }

            bool first = true;

            for (auto& cost : m_pimpl->costs){
                if (cost.second.timeRange.isInRange(time)){

                    if (!cost.second.cost->costSecondPartialDerivativeWRTStateControl(time, state, control, cost.second.mixedHessianBuffer)){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating cost " << cost.second.cost->name() <<".";
                        reportError("OptimalControlProblem", "costSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                        return false;
                    }

                    if ((cost.second.mixedHessianBuffer.rows() != state.size()) || (cost.second.mixedHessianBuffer.cols() != control.size())){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating " << cost.second.cost->name() <<": " << "the hessian size is expected to have as many rows as the state dimension and a number of columns matching the control dimension.";
                        reportError("OptimalControlProblem", "costSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                        return false;
                    }

                    if (first){
                        toEigen(partialDerivative) = cost.second.weight * toEigen(cost.second.mixedHessianBuffer);
                        first = false;
                    } else {
                        toEigen(partialDerivative) += cost.second.weight * toEigen(cost.second.mixedHessianBuffer);
                    }
                }
            }
            return true;
        }